

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

void ucnv_MBCSGetFilteredUnicodeSetForUnicode_63
               (UConverterSharedData *sharedData,USetAdder *sa,UConverterUnicodeSet which,
               UConverterSetFilter filter,UErrorCode *pErrorCode)

{
  byte *pbVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint16_t *puVar4;
  uint8_t *puVar5;
  ushort uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  long lVar11;
  ushort *puVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint16_t *results;
  ushort local_84;
  
  puVar4 = (sharedData->mbcs).fromUnicodeTable;
  puVar5 = (sharedData->mbcs).fromUnicodeBytes;
  uVar9 = ((sharedData->mbcs).unicodeMask & 1) << 10 | 0x40;
  uVar2 = (sharedData->mbcs).outputType;
  if (uVar2 == '\0') {
    uVar10 = 0x800;
    if (which == UCNV_ROUNDTRIP_SET) {
      uVar10 = 0xf00;
    }
    uVar8 = 0;
    uVar15 = 0;
    do {
      uVar3 = puVar4[uVar8];
      if (uVar9 < uVar3) {
        lVar13 = 0;
        do {
          if ((ulong)puVar4[(ulong)uVar3 + lVar13] == 0) {
            uVar15 = uVar15 + 0x10;
          }
          else {
            puVar12 = (ushort *)(puVar5 + (ulong)puVar4[(ulong)uVar3 + lVar13] * 2);
            do {
              if (uVar10 <= *puVar12) {
                (*(code *)sa->add)(sa->set,uVar15);
              }
              puVar12 = puVar12 + 1;
              uVar15 = uVar15 + 1;
            } while ((uVar15 & 0xf) != 0);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
      }
      else {
        uVar15 = uVar15 + 0x400;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  else {
    lVar13 = 3;
    if ((uVar2 != '\x02') && (uVar2 != '\t')) {
      if (uVar2 == '\x03') {
        lVar13 = 4;
      }
      else {
        lVar13 = 2;
      }
    }
    uVar10 = 0;
    uVar15 = 0;
    do {
      uVar3 = puVar4[uVar10];
      if (uVar9 >> 1 < (uint)uVar3) {
        lVar11 = 0;
        do {
          uVar14 = *(uint *)(puVar4 + (ulong)uVar3 * 2 + lVar11 * 2);
          if (uVar14 == 0) {
            uVar15 = uVar15 + 0x10;
          }
          else {
            if (UCNV_SET_FILTER_HZ < filter) {
              *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
              return;
            }
            puVar12 = (ushort *)(puVar5 + (uVar14 & 0xffff) * (int)lVar13 * 0x10);
            uVar14 = uVar14 >> 0x10;
            switch(filter) {
            case UCNV_SET_FILTER_NONE:
              do {
                if ((uVar14 & 1) == 0) {
                  if (which == UCNV_ROUNDTRIP_AND_FALLBACK_SET) {
                    bVar7 = 0;
                    if (lVar13 != 2) {
                      if ((int)lVar13 != 3) {
                        bVar7 = (byte)*puVar12;
                        puVar12 = (ushort *)((long)puVar12 + 1);
                      }
                      bVar7 = bVar7 | (byte)*puVar12;
                      puVar12 = (ushort *)((long)puVar12 + 1);
                    }
                    uVar6 = *puVar12;
                    pbVar1 = (byte *)((long)puVar12 + 1);
                    puVar12 = puVar12 + 1;
                    if ((bVar7 != 0 || (byte)uVar6 != 0) || *pbVar1 != 0) {
                      (*(code *)sa->add)(sa->set,uVar15);
                    }
                  }
                }
                else {
                  (*(code *)sa->add)(sa->set,uVar15);
                  puVar12 = (ushort *)((long)puVar12 + lVar13);
                }
                uVar14 = uVar14 >> 1;
                uVar15 = uVar15 + 1;
              } while ((uVar15 & 0xf) != 0);
              break;
            case UCNV_SET_FILTER_DBCS_ONLY:
              do {
                if (((which == UCNV_ROUNDTRIP_AND_FALLBACK_SET) || ((uVar14 & 1) != 0)) &&
                   (0xff < *puVar12)) {
                  (*(code *)sa->add)(sa->set,uVar15);
                }
                uVar14 = uVar14 >> 1;
                puVar12 = puVar12 + 1;
                uVar15 = uVar15 + 1;
              } while ((uVar15 & 0xf) != 0);
              break;
            case UCNV_SET_FILTER_2022_CN:
              do {
                if (((which == UCNV_ROUNDTRIP_AND_FALLBACK_SET) || ((uVar14 & 1) != 0)) &&
                   ((byte)((byte)*puVar12 + 0x7f) < 2)) {
                  (*(code *)sa->add)(sa->set,uVar15);
                }
                uVar14 = uVar14 >> 1;
                puVar12 = (ushort *)((long)puVar12 + 3);
                uVar15 = uVar15 + 1;
              } while ((uVar15 & 0xf) != 0);
              break;
            case UCNV_SET_FILTER_SJIS:
              do {
                if (((which == UCNV_ROUNDTRIP_AND_FALLBACK_SET) || ((uVar14 & 1) != 0)) &&
                   ((ushort)(*puVar12 + 0x7ec0) < 0x6ebd)) {
                  (*(code *)sa->add)(sa->set,uVar15);
                }
                uVar14 = uVar14 >> 1;
                puVar12 = puVar12 + 1;
                uVar15 = uVar15 + 1;
              } while ((uVar15 & 0xf) != 0);
              break;
            case UCNV_SET_FILTER_GR94DBCS:
              do {
                if (((which == UCNV_ROUNDTRIP_AND_FALLBACK_SET) || ((uVar14 & 1) != 0)) &&
                   (((ushort)(*puVar12 + 0x5e5f) < 0x5d5e && ((*puVar12 + 0x5f & 0xfe) < 0x5e)))) {
                  (*(code *)sa->add)(sa->set,uVar15);
                }
                uVar14 = uVar14 >> 1;
                puVar12 = puVar12 + 1;
                uVar15 = uVar15 + 1;
              } while ((uVar15 & 0xf) != 0);
              break;
            case UCNV_SET_FILTER_HZ:
              do {
                if ((((which == UCNV_ROUNDTRIP_AND_FALLBACK_SET) || ((uVar14 & 1) != 0)) &&
                    ((ushort)(*puVar12 + 0x5e5f) < 0x5c5e)) && ((*puVar12 + 0x5f & 0xfe) < 0x5e)) {
                  (*(code *)sa->add)(sa->set,uVar15);
                }
                uVar14 = uVar14 >> 1;
                puVar12 = puVar12 + 1;
                uVar15 = uVar15 + 1;
              } while ((uVar15 & 0xf) != 0);
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x40);
      }
      else {
        uVar15 = uVar15 + 0x400;
      }
      uVar10 = uVar10 + 1;
      local_84 = (ushort)uVar9;
    } while (uVar10 < local_84);
  }
  ucnv_extGetUnicodeSet_63(sharedData,sa,which,filter,pErrorCode);
  return;
}

Assistant:

U_CFUNC void 
ucnv_MBCSGetFilteredUnicodeSetForUnicode(const UConverterSharedData *sharedData,
                                         const USetAdder *sa,
                                         UConverterUnicodeSet which,
                                         UConverterSetFilter filter,
                                         UErrorCode *pErrorCode) {
    const UConverterMBCSTable *mbcsTable;
    const uint16_t *table;

    uint32_t st3;
    uint16_t st1, maxStage1, st2;

    UChar32 c;

    /* enumerate the from-Unicode trie table */
    mbcsTable=&sharedData->mbcs;
    table=mbcsTable->fromUnicodeTable;
    if(mbcsTable->unicodeMask&UCNV_HAS_SUPPLEMENTARY) {
        maxStage1=0x440;
    } else {
        maxStage1=0x40;
    }

    c=0; /* keep track of the current code point while enumerating */

    if(mbcsTable->outputType==MBCS_OUTPUT_1) {
        const uint16_t *stage2, *stage3, *results;
        uint16_t minValue;

        results=(const uint16_t *)mbcsTable->fromUnicodeBytes;

        /*
         * Set a threshold variable for selecting which mappings to use.
         * See ucnv_MBCSSingleFromBMPWithOffsets() and
         * MBCS_SINGLE_RESULT_FROM_U() for details.
         */
        if(which==UCNV_ROUNDTRIP_SET) {
            /* use only roundtrips */
            minValue=0xf00;
        } else /* UCNV_ROUNDTRIP_AND_FALLBACK_SET */ {
            /* use all roundtrip and fallback results */
            minValue=0x800;
        }

        for(st1=0; st1<maxStage1; ++st1) {
            st2=table[st1];
            if(st2>maxStage1) {
                stage2=table+st2;
                for(st2=0; st2<64; ++st2) {
                    if((st3=stage2[st2])!=0) {
                        /* read the stage 3 block */
                        stage3=results+st3;

                        do {
                            if(*stage3++>=minValue) {
                                sa->add(sa->set, c);
                            }
                        } while((++c&0xf)!=0);
                    } else {
                        c+=16; /* empty stage 3 block */
                    }
                }
            } else {
                c+=1024; /* empty stage 2 block */
            }
        }
    } else {
        const uint32_t *stage2;
        const uint8_t *stage3, *bytes;
        uint32_t st3Multiplier;
        uint32_t value;
        UBool useFallback;

        bytes=mbcsTable->fromUnicodeBytes;

        useFallback=(UBool)(which==UCNV_ROUNDTRIP_AND_FALLBACK_SET);

        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4_EUC:
            st3Multiplier=3;
            break;
        case MBCS_OUTPUT_4:
            st3Multiplier=4;
            break;
        default:
            st3Multiplier=2;
            break;
        }

        for(st1=0; st1<maxStage1; ++st1) {
            st2=table[st1];
            if(st2>(maxStage1>>1)) {
                stage2=(const uint32_t *)table+st2;
                for(st2=0; st2<64; ++st2) {
                    if((st3=stage2[st2])!=0) {
                        /* read the stage 3 block */
                        stage3=bytes+st3Multiplier*16*(uint32_t)(uint16_t)st3;

                        /* get the roundtrip flags for the stage 3 block */
                        st3>>=16;

                        /*
                         * Add code points for which the roundtrip flag is set,
                         * or which map to non-zero bytes if we use fallbacks.
                         * See ucnv_MBCSFromUnicodeWithOffsets() for details.
                         */
                        switch(filter) {
                        case UCNV_SET_FILTER_NONE:
                            do {
                                if(st3&1) {
                                    sa->add(sa->set, c);
                                    stage3+=st3Multiplier;
                                } else if(useFallback) {
                                    uint8_t b=0;
                                    switch(st3Multiplier) {
                                    case 4:
                                        b|=*stage3++;
                                        U_FALLTHROUGH;
                                    case 3:
                                        b|=*stage3++;
                                        U_FALLTHROUGH;
                                    case 2:
                                        b|=stage3[0]|stage3[1];
                                        stage3+=2;
                                        U_FALLTHROUGH;
                                    default:
                                        break;
                                    }
                                    if(b!=0) {
                                        sa->add(sa->set, c);
                                    }
                                }
                                st3>>=1;
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_DBCS_ONLY:
                             /* Ignore single-byte results (<0x100). */
                            do {
                                if(((st3&1)!=0 || useFallback) && *((const uint16_t *)stage3)>=0x100) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_2022_CN:
                             /* Only add code points that map to CNS 11643 planes 1 & 2 for non-EXT ISO-2022-CN. */
                            do {
                                if(((st3&1)!=0 || useFallback) && ((value=*stage3)==0x81 || value==0x82)) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=3;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_SJIS:
                             /* Only add code points that map to Shift-JIS codes corresponding to JIS X 0208. */
                            do {
                                if(((st3&1)!=0 || useFallback) && (value=*((const uint16_t *)stage3))>=0x8140 && value<=0xeffc) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_GR94DBCS:
                            /* Only add code points that map to ISO 2022 GR 94 DBCS codes (each byte A1..FE). */
                            do {
                                if( ((st3&1)!=0 || useFallback) &&
                                    (uint16_t)((value=*((const uint16_t *)stage3)) - 0xa1a1)<=(0xfefe - 0xa1a1) &&
                                    (uint8_t)(value-0xa1)<=(0xfe - 0xa1)
                                ) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_HZ:
                            /* Only add code points that are suitable for HZ DBCS (lead byte A1..FD). */
                            do {
                                if( ((st3&1)!=0 || useFallback) &&
                                    (uint16_t)((value=*((const uint16_t *)stage3))-0xa1a1)<=(0xfdfe - 0xa1a1) &&
                                    (uint8_t)(value-0xa1)<=(0xfe - 0xa1)
                                ) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        default:
                            *pErrorCode=U_INTERNAL_PROGRAM_ERROR;
                            return;
                        }
                    } else {
                        c+=16; /* empty stage 3 block */
                    }
                }
            } else {
                c+=1024; /* empty stage 2 block */
            }
        }
    }

    ucnv_extGetUnicodeSet(sharedData, sa, which, filter, pErrorCode);
}